

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O1

void setgemprobs(d_level *dlev)

{
  xchar xVar1;
  xchar xVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  short *psVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  
  if (dlev == (d_level *)0x0) {
    uVar4 = 9;
  }
  else {
    xVar1 = ledger_no(dlev);
    xVar2 = maxledgerno();
    if (xVar2 < xVar1) {
      cVar3 = maxledgerno();
    }
    else {
      cVar3 = ledger_no(dlev);
    }
    cVar3 = (char)((uint)(cVar3 * 0x55) >> 8) - cVar3;
    uVar4 = (uint)(char)(((cVar3 >> 1) - (cVar3 >> 7)) + '\t');
  }
  lVar10 = (long)bases[0xd];
  if ((int)uVar4 < 1) {
    uVar7 = 0;
  }
  else {
    psVar6 = &objects[lVar10].oc_prob;
    uVar7 = 0;
    do {
      *psVar6 = 0;
      uVar7 = uVar7 + 1;
      psVar6 = psVar6 + 0x14;
    } while (uVar4 != uVar7);
  }
  uVar9 = (int)uVar7 + lVar10;
  iVar8 = (int)uVar9;
  if (((0x205 < iVar8) || (objects[uVar9].oc_class != '\r')) ||
     (obj_descr[objects[uVar9].oc_name_idx].oc_name == (char *)0x0)) {
    raw_printf("Not enough gems? - first=%d j=%d LAST_GEM=%d\n",uVar9 & 0xffffffff,
               uVar7 & 0xffffffff,0x205);
  }
  if (iVar8 < 0x206) {
    psVar6 = &objects[lVar10 + (uVar7 & 0xffffffff)].oc_prob;
    lVar10 = lVar10 + (uVar7 & 0xffffffff);
    iVar5 = 0xab;
    do {
      lVar10 = lVar10 + 1;
      *psVar6 = (short)(iVar5 / (0x206 - iVar8));
      iVar5 = iVar5 + 1;
      psVar6 = psVar6 + 0x14;
    } while ((int)lVar10 != 0x206);
  }
  return;
}

Assistant:

static void setgemprobs(const d_level *dlev)
{
	int j, first, lev;

	if (dlev)
	    lev = (ledger_no(dlev) > maxledgerno())
				? maxledgerno() : ledger_no(dlev);
	else
	    lev = 0;
	first = bases[GEM_CLASS];

	for (j = 0; j < 9-lev/3; j++)
		objects[first+j].oc_prob = 0;
	first += j;
	if (first > LAST_GEM || objects[first].oc_class != GEM_CLASS ||
	    OBJ_NAME(objects[first]) == NULL) {
		raw_printf("Not enough gems? - first=%d j=%d LAST_GEM=%d\n",
			first, j, LAST_GEM);
	    }
	for (j = first; j <= LAST_GEM; j++)
		objects[j].oc_prob = (171+j-first)/(LAST_GEM+1-first);
}